

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O2

CImg<float> * __thiscall cimg_library::CImg<float>::swap(CImg<float> *this,CImg<float> *img)

{
  bool bVar1;
  uint uVar2;
  float *pfVar3;
  
  uVar2 = this->_width;
  this->_width = img->_width;
  img->_width = uVar2;
  uVar2 = this->_height;
  this->_height = img->_height;
  img->_height = uVar2;
  uVar2 = this->_depth;
  this->_depth = img->_depth;
  img->_depth = uVar2;
  uVar2 = this->_spectrum;
  this->_spectrum = img->_spectrum;
  img->_spectrum = uVar2;
  pfVar3 = this->_data;
  this->_data = img->_data;
  img->_data = pfVar3;
  bVar1 = this->_is_shared;
  this->_is_shared = img->_is_shared;
  img->_is_shared = bVar1;
  return img;
}

Assistant:

CImg<T>& swap(CImg<T>& img) {
      cimg::swap(_width,img._width);
      cimg::swap(_height,img._height);
      cimg::swap(_depth,img._depth);
      cimg::swap(_spectrum,img._spectrum);
      cimg::swap(_data,img._data);
      cimg::swap(_is_shared,img._is_shared);
      return img;
    }